

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

vec3 __thiscall vera::Camera::worldToCamera(Camera *this,vec3 *_world,mat4 *_model)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar3;
  vec3 vVar4;
  col_type cVar5;
  col_type local_20;
  undefined8 extraout_XMM0_Qb;
  
  local_20.field_3.w = 1.0;
  local_20.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&_world->field_0;
  local_20.field_1 =
       *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&_world->field_1;
  local_20.field_2 =
       *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)&_world->field_2;
  if (_model != (mat4 *)0x0) {
    local_20 = glm::operator*(_model,&local_20);
  }
  cVar5 = glm::operator*(&this->m_projectionViewMatrix,&local_20);
  auVar1._0_8_ = cVar5._0_8_;
  auVar1._8_8_ = extraout_XMM0_Qb;
  aVar3 = cVar5.field_3;
  auVar2._4_4_ = aVar3;
  auVar2._0_4_ = aVar3;
  auVar2._8_4_ = aVar3;
  auVar2._12_4_ = aVar3;
  auVar2 = divps(auVar1,auVar2);
  vVar4.field_2.z = cVar5.field_2.z / aVar3.w;
  vVar4._0_8_ = auVar2._0_8_;
  return vVar4;
}

Assistant:

glm::vec3 Camera::worldToCamera(const glm::vec3* _world, glm::mat4* _model) const {
    glm::vec4 pos = glm::vec4(*_world, 1.0f);
    if (_model != nullptr)
        pos = (*_model) * pos;
    glm::vec4 camera = m_projectionViewMatrix * pos;
    return glm::vec3(camera) / camera.w;
}